

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void mocker::nasm::printModule(Module *module,ostream *out)

{
  bool bVar1;
  ostream *poVar2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>_>
  *this;
  reference pvVar3;
  shared_ptr<mocker::nasm::Directive> *directive_00;
  value_type *kv;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>_>
  *__range2_1;
  string local_70;
  nasm *local_50;
  shared_ptr<mocker::nasm::Directive> *directive;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
  *__range2;
  ostream *out_local;
  Module *module_local;
  
  Module::getDirectives
            ((vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
              *)&__begin2,module);
  __end2 = std::
           vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
           ::begin((vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
                    *)&__begin2);
  directive = (shared_ptr<mocker::nasm::Directive> *)
              std::
              vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
              ::end((vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
                     *)&__begin2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::shared_ptr<mocker::nasm::Directive>_*,_std::vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>_>
                                *)&directive);
    if (!bVar1) break;
    local_50 = (nasm *)__gnu_cxx::
                       __normal_iterator<const_std::shared_ptr<mocker::nasm::Directive>_*,_std::vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>_>
                       ::operator*(&__end2);
    fmtDirective_abi_cxx11_(&local_70,local_50,directive_00);
    poVar2 = std::operator<<(out,(string *)&local_70);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&local_70);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<mocker::nasm::Directive>_*,_std::vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
  ::~vector((vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
             *)&__begin2);
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  this = Module::getSections_abi_cxx11_(module);
  __end2_1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>_>
             ::begin(this);
  kv = (value_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>_>
       ::end(this);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2_1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                         *)&kv);
    if (!bVar1) break;
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_false,_true>
             ::operator*(&__end2_1);
    printSection(&pvVar3->second,out);
    std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_false,_true>
    ::operator++(&__end2_1);
  }
  return;
}

Assistant:

void printModule(const Module &module, std::ostream &out) {
  for (auto &directive : module.getDirectives())
    out << fmtDirective(directive) << '\n';
  out << std::endl;

  for (auto &kv : module.getSections()) {
    printSection(kv.second, out);
    out << std::endl;
  }
}